

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O3

ostream * glcts::operator<<(ostream *stream,var2str *var)

{
  char *pcVar1;
  size_t sVar2;
  
  pcVar1 = var->m_prefix;
  if (pcVar1 != (char *)0x0) {
    sVar2 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar1,sVar2);
  }
  pcVar1 = var->m_name;
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)stream + (int)stream->_vptr_basic_ostream[-3]);
  }
  else {
    sVar2 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar1,sVar2);
  }
  if (var->m_index != (GLchar *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(stream,"[",1);
    pcVar1 = var->m_index;
    if (pcVar1 == (char *)0x0) {
      std::ios::clear((int)stream + (int)stream->_vptr_basic_ostream[-3]);
    }
    else {
      sVar2 = strlen(pcVar1);
      std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar1,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>(stream,"]",1);
  }
  return stream;
}

Assistant:

std::ostream& operator<<(std::ostream& stream, const var2str& var)
{
	if (0 != var.m_prefix)
	{
		stream << var.m_prefix;
	}

	stream << var.m_name;

	if (0 != var.m_index)
	{
		stream << "[" << var.m_index << "]";
	}

	return stream;
}